

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall antlr::Parser::traceIn(Parser *this,char *rname)

{
  int iVar1;
  ostream *poVar2;
  int i;
  int iVar3;
  char *pcVar4;
  TokenRefCount<antlr::Token> local_50;
  char *local_48 [4];
  
  iVar1 = this->traceDepth + 1;
  this->traceDepth = iVar1;
  for (iVar3 = 0; iVar3 < iVar1; iVar3 = iVar3 + 1) {
    std::operator<<((ostream *)&std::cout," ");
    iVar1 = this->traceDepth;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"> ");
  poVar2 = std::operator<<(poVar2,rname);
  poVar2 = std::operator<<(poVar2,"; LA(1)==");
  (*this->_vptr_Parser[3])(&local_50,this,1);
  (*(local_50.ref)->ptr->_vptr_Token[4])(local_48);
  poVar2 = std::operator<<(poVar2,local_48[0]);
  pcVar4 = "";
  if (0 < ((this->inputState).ref)->ptr->guessing) {
    pcVar4 = " [guessing]";
  }
  poVar2 = std::operator<<(poVar2,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)local_48);
  TokenRefCount<antlr::Token>::~TokenRefCount(&local_50);
  return;
}

Assistant:

void Parser::traceIn(const char* rname)
{
	traceDepth++;

	for( int i = 0; i < traceDepth; i++ )
		ANTLR_USE_NAMESPACE(std)cout << " ";

	ANTLR_USE_NAMESPACE(std)cout << "> " << rname
		<< "; LA(1)==" << LT(1)->getText().c_str()
		<<	((inputState->guessing>0)?" [guessing]":"")
		<< ANTLR_USE_NAMESPACE(std)endl;
}